

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11ResourceULT.cpp
# Opt level: O1

void __thiscall
CTestGen11Resource_TestPlanar2D_NV12_Test::TestBody(CTestGen11Resource_TestPlanar2D_NV12_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar1;
  int iVar2;
  bool bVar3;
  GMM_RESOURCE_INFO *ResourceInfo;
  long lVar4;
  char *pcVar5;
  uint32_t ExpectedValue;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  undefined1 auStack_e8 [8];
  GMM_RESCREATE_PARAMS gmmParams;
  internal local_50 [8];
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  lVar4 = 0;
  do {
    gmmParams.pExistingSysMem = 0;
    gmmParams.MaximumRenamingListLength = 0;
    gmmParams.NoGfxMemory = '\0';
    gmmParams._109_3_ = 0;
    gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
    gmmParams.BaseAlignment = 0;
    gmmParams.OverridePitch = 0;
    gmmParams.RotateInfo = 0;
    gmmParams._84_4_ = 0;
    gmmParams.BaseHeight = 0;
    gmmParams.Depth = 0;
    gmmParams.MaxLod = 0;
    gmmParams.ArraySize = 0;
    gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
    gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
    gmmParams.MSAA.NumSamples = 0;
    gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
    gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x0;
    gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
    auStack_e8._0_4_ = RESOURCE_2D;
    auStack_e8._4_4_ = GMM_FORMAT_INVALID;
    gmmParams.ExistingSysMemSize = 0x100000000;
    gmmParams.Type = RESOURCE_INVALID;
    gmmParams.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
    gmmParams.CpTag = 0x100;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth64 = 0x100000100;
    CTestResource::SetTileFlag
              ((CTestResource *)this,(GMM_RESCREATE_PARAMS *)auStack_e8,
               *(TEST_TILE_TYPE *)((long)&DAT_001a9c68 + lVar4));
    auStack_e8._4_4_ = GMM_FORMAT_NV12;
    ResourceInfo = (GMM_RESOURCE_INFO *)
                   (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                             (CommonULT::pGmmULTClientContext,(GMM_RESCREATE_PARAMS *)auStack_e8);
    if (lVar4 == 0) {
      iVar8 = (gmmParams.field_6.BaseWidth >> 1) + gmmParams.field_6.BaseWidth;
    }
    else {
      iVar8 = *(int *)((long)&DAT_001a9c84 + lVar4 * 2);
      iVar8 = (iVar8 + -1 + (gmmParams.field_6.BaseWidth >> 1) & -iVar8) +
              (iVar8 + -1 + gmmParams.field_6.BaseWidth & -iVar8);
    }
    uVar7 = (ulong)(*(int *)((long)&DAT_001a9c80 + lVar4 * 2) - 1);
    uVar7 = ~uVar7 & gmmParams._40_8_ + uVar7;
    ExpectedValue = (uint32_t)uVar7;
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,ResourceInfo,ExpectedValue);
    if (lVar4 != 0) {
      CTestResource::VerifyResourcePitchInTiles<true>
                ((CTestResource *)this,ResourceInfo,
                 (uint32_t)
                 ((uVar7 & 0xffffffff) / (ulong)*(uint *)((long)&DAT_001a9c80 + lVar4 * 2)));
    }
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this,ResourceInfo,
               (ulong)(iVar8 * ExpectedValue + 0xfff & 0xfffff000));
    gtest_ar.message_.ptr_._0_4_ = 0;
    local_38.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,1);
    psVar1 = &gtest_ar.message_;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_50,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y)",(int *)psVar1,
               (unsigned_long *)&local_38);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
                 ,0x25e,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
        local_38.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    local_38.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,1);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_50,"0","ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y)",(int *)psVar1,
               (unsigned_long *)&local_38);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
                 ,0x25f,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
        local_38.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    local_38.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,2);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_50,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_U)",(int *)psVar1,
               (unsigned_long *)&local_38);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
                 ,0x262,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
        local_38.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    local_38.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,3);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_50,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_V)",(int *)psVar1,
               (unsigned_long *)&local_38);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
                 ,0x263,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
        local_38.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (lVar4 == 0) {
      local_38.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,2);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_50,"gmmParams.BaseHeight","ResourceInfo->GetPlanarYOffset(GMM_PLANE_U)",
                 &gmmParams.field_6.BaseWidth,(unsigned_long *)&local_38);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)psVar1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
                   ,0x26c,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
        if (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (local_38.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_38.ptr_ + 8))();
          }
          local_38.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_38.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,3);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_50,"gmmParams.BaseHeight","ResourceInfo->GetPlanarYOffset(GMM_PLANE_V)",
                 &gmmParams.field_6.BaseWidth,(unsigned_long *)&local_38);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)psVar1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
                   ,0x26d,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
        if (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (local_38.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_38.ptr_ + 8))();
          }
          local_38.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      iVar2 = *(int *)((long)&DAT_001a9c84 + lVar4 * 2);
      iVar8 = iVar2 + -1;
      uVar6 = -iVar2;
      gtest_ar.message_.ptr_._0_4_ = gmmParams.field_6.BaseWidth + iVar8 & uVar6;
      local_38.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,2);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_50,
                 "(((gmmParams.BaseHeight) + ((TileSize[TileIndex][1]) - 1)) - (((gmmParams.BaseHeight) + ((TileSize[TileIndex][1]) - 1)) & ((TileSize[TileIndex][1]) - 1)))"
                 ,"ResourceInfo->GetPlanarYOffset(GMM_PLANE_U)",(uint *)&gtest_ar.message_,
                 (unsigned_long *)&local_38);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        psVar1 = &gtest_ar.message_;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)psVar1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
                   ,0x267,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
        if (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (local_38.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_38.ptr_ + 8))();
          }
          local_38.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = iVar8 + gmmParams.field_6.BaseWidth & uVar6;
      local_38.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,3);
      psVar1 = &gtest_ar.message_;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_50,
                 "(((gmmParams.BaseHeight) + ((TileSize[TileIndex][1]) - 1)) - (((gmmParams.BaseHeight) + ((TileSize[TileIndex][1]) - 1)) & ((TileSize[TileIndex][1]) - 1)))"
                 ,"ResourceInfo->GetPlanarYOffset(GMM_PLANE_V)",(uint *)psVar1,
                 (unsigned_long *)&local_38);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)psVar1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
                   ,0x268,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
        if (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (local_38.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_38.ptr_ + 8))();
          }
          local_38.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xc);
  return;
}

Assistant:

TEST_F(CTestGen11Resource, TestPlanar2D_NV12)
{
    /* Test planar surface with hybrid UV planes where UV plane is half the size
    of Y and U/V data is packed together */
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // [UV-Packing]
    const TEST_TILE_TYPE TileTypes[] = {TEST_LINEAR, TEST_TILEX, TEST_TILEY};

    const uint32_t TileSize[3][2] = {{1, 1},     //Linear
                                  {512, 8},   // TileX
                                  {128, 32}}; // TileY
    for(uint32_t TileIndex = 0; TileIndex < sizeof(TileTypes) / sizeof(TileTypes[0]); TileIndex++)
    {
        TEST_TILE_TYPE Tile = TileTypes[TileIndex];

        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Type                 = RESOURCE_2D;
        gmmParams.NoGfxMemory          = 1;
        gmmParams.Flags.Gpu.Texture    = 1;
        gmmParams.BaseWidth64          = 0x100;
        gmmParams.BaseHeight           = 0x100;
        gmmParams.Depth                = 0x1;
        SetTileFlag(gmmParams, static_cast<TEST_TILE_TYPE>(Tile));
        gmmParams.Format = GMM_FORMAT_NV12;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t Pitch, Height;

        if(Tile != TEST_LINEAR)
        {
            Pitch = GMM_ULT_ALIGN(gmmParams.BaseWidth64, TileSize[TileIndex][0]);

            Height = GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[TileIndex][1]) +
                     GMM_ULT_ALIGN(gmmParams.BaseHeight / 2, TileSize[TileIndex][1]);
        }
        else
        {
            Pitch  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, TileSize[TileIndex][0]);
            Height = GMM_ULT_ALIGN(gmmParams.BaseHeight /*Y*/ + gmmParams.BaseHeight / 2 /*UV*/, TileSize[TileIndex][1]);
        }

        uint32_t Size = GMM_ULT_ALIGN(Pitch * Height, GMM_KBYTE(4));

        VerifyResourcePitch<true>(ResourceInfo, Pitch);
        if(Tile != TEST_LINEAR)
        {
            VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[TileIndex][0]);
        }
        VerifyResourceSize<true>(ResourceInfo, Size);
        VerifyResourceHAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceVAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for planar

        // Y plane should be at 0,0
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y));
        EXPECT_EQ(0, ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y));

        // U/V plane should be at end of Y plane
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_U));
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_V));

        if(Tile != TEST_LINEAR)
        {
            EXPECT_EQ(GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[TileIndex][1]), ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));
            EXPECT_EQ(GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[TileIndex][1]), ResourceInfo->GetPlanarYOffset(GMM_PLANE_V));
        }
        else
        {
            EXPECT_EQ(gmmParams.BaseHeight, ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));
            EXPECT_EQ(gmmParams.BaseHeight, ResourceInfo->GetPlanarYOffset(GMM_PLANE_V));
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}